

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall leveldb::log::_Test_OpenForAppend::_Run(_Test_OpenForAppend *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_1e0;
  undefined1 local_1c0 [24];
  stringstream local_1a8 [392];
  
  pcVar1 = local_1c0 + 0x10;
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"hello","");
  LogTest::Write(&this->super_LogTest,(string *)local_1c0);
  if ((pointer)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_);
  }
  LogTest::ReopenForAppend(&this->super_LogTest);
  local_1c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"world","");
  LogTest::Write(&this->super_LogTest,(string *)local_1c0);
  if ((pointer)local_1c0._0_8_ != pcVar1) {
    operator_delete((void *)local_1c0._0_8_);
  }
  local_1c0[0] = 1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x15a;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LogTest::Read_abi_cxx11_(&local_1e0,&this->super_LogTest);
  test::Tester::IsEq<char[6],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [6])"hello",&local_1e0);
  paVar2 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = 1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x15b;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LogTest::Read_abi_cxx11_(&local_1e0,&this->super_LogTest);
  test::Tester::IsEq<char[6],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [6])"world",&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  local_1c0[0] = 1;
  local_1c0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c0._16_4_ = 0x15c;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LogTest::Read_abi_cxx11_(&local_1e0,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)local_1c0,(char (*) [4])"EOF",&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_1c0);
  return;
}

Assistant:

TEST(LogTest, OpenForAppend) {
  Write("hello");
  ReopenForAppend();
  Write("world");
  ASSERT_EQ("hello", Read());
  ASSERT_EQ("world", Read());
  ASSERT_EQ("EOF", Read());
}